

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pcap-linux.c
# Opt level: O0

int reset_kernel_filter(pcap_t *handle)

{
  int iVar1;
  undefined4 local_14;
  pcap_t *ppStack_10;
  int dummy;
  pcap_t *handle_local;
  
  local_14 = 0;
  ppStack_10 = handle;
  iVar1 = setsockopt(handle->fd,1,0x1b,&local_14,4);
  return iVar1;
}

Assistant:

static int
reset_kernel_filter(pcap_t *handle)
{
	/*
	 * setsockopt() barfs unless it get a dummy parameter.
	 * valgrind whines unless the value is initialized,
	 * as it has no idea that setsockopt() ignores its
	 * parameter.
	 */
	int dummy = 0;

	return setsockopt(handle->fd, SOL_SOCKET, SO_DETACH_FILTER,
				   &dummy, sizeof(dummy));
}